

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<int,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<int,_fmt::v6::basic_format_specs<char>_> *this)

{
  long *plVar1;
  char cVar2;
  locale *plVar3;
  int iVar4;
  num_writer f;
  char cVar5;
  int iVar6;
  int iVar7;
  numpunct *pnVar8;
  long *plVar9;
  long *plVar10;
  uint uVar11;
  int iVar12;
  string_view prefix;
  string groups;
  locale local_58 [8];
  uint local_50;
  int iStack_4c;
  long **pplStack_48;
  char local_40;
  undefined7 uStack_3f;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  plVar3 = (locale *)(this->writer->locale_).locale_;
  if (plVar3 == (locale *)0x0) {
    std::locale::locale(local_58);
  }
  else {
    std::locale::locale(local_58,plVar3);
  }
  pnVar8 = std::use_facet<std::__cxx11::numpunct<char>>(local_58);
  (**(code **)(*(long *)pnVar8 + 0x20))(&local_38,pnVar8);
  std::locale::~locale(local_58);
  if (local_30 == 0) {
    on_dec(this);
  }
  else {
    plVar3 = (locale *)(this->writer->locale_).locale_;
    if (plVar3 == (locale *)0x0) {
      std::locale::locale(local_58);
    }
    else {
      std::locale::locale(local_58,plVar3);
    }
    pnVar8 = std::use_facet<std::__cxx11::numpunct<char>>(local_58);
    cVar5 = (**(code **)(*(long *)pnVar8 + 0x18))(pnVar8);
    std::locale::~locale(local_58);
    if (cVar5 == '\0') {
      on_dec(this);
    }
    else {
      local_50 = this->abs_value;
      uVar11 = 0x1f;
      if ((local_50 | 1) != 0) {
        for (; (local_50 | 1) >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar11 = (uVar11 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
      iVar6 = uVar11 + (*(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar11 * 4) <=
                       local_50);
      plVar1 = (long *)((long)local_38 + local_30);
      plVar10 = local_38;
      iVar7 = iVar6;
      iStack_4c = iVar6;
      if (local_30 != 0) {
        iVar4 = (int)local_30;
        plVar9 = local_38;
        do {
          cVar2 = (char)*plVar9;
          iVar12 = iVar7 - cVar2;
          plVar10 = plVar9;
          iStack_4c = iVar6;
          if ((iVar12 == 0 || iVar7 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          iVar6 = iVar6 + 1;
          plVar9 = (long *)((long)plVar9 + 1);
          local_30 = local_30 + -1;
          plVar10 = plVar1;
          iVar7 = iVar12;
          iStack_4c = iVar4 + uVar11 + (*(uint *)(basic_data<void>::zero_or_powers_of_10_32 +
                                                 (ulong)uVar11 * 4) <= local_50);
        } while (local_30 != 0);
      }
      if (plVar10 == plVar1) {
        iStack_4c = iStack_4c + (iVar7 + -1) / (int)*(char *)((long)plVar1 + -1);
      }
      f._17_7_ = uStack_3f;
      f.sep = cVar5;
      f.size = iStack_4c;
      f.abs_value = local_50;
      f.groups = (string *)&local_38;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      pplStack_48 = &local_38;
      local_40 = cVar5;
      basic_writer<fmt::v6::buffer_range<char>>::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<int,fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<fmt::v6::buffer_range<char>> *)this->writer,iStack_4c,prefix,
                 *this->specs,f);
    }
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }